

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

VectorXd __thiscall mnf::Point::pseudoLog(Point *this,Point *y)

{
  Manifold *this_00;
  double *size;
  long in_RDX;
  Index extraout_RDX;
  Index outer_stride;
  VectorXd VVar1;
  ConstRefVec local_98;
  _func_int **local_70;
  double *local_68;
  ConstRefVec local_58;
  
  size = (double *)Manifold::tangentDim((y->super_SubPoint).super_ConstSubPoint.manifold_);
  this->_vptr_Point = (_func_int **)0x0;
  (this->super_PointMemory).mem_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (size == (double *)0x0) {
    local_70 = (_func_int **)0x0;
  }
  else {
    local_70 = (_func_int **)
               Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size);
    this->_vptr_Point = local_70;
  }
  (this->super_PointMemory).mem_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = size;
  this_00 = (y->super_SubPoint).super_ConstSubPoint.manifold_;
  local_98.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_98.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  local_98.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = *(PointerType *)
             &(y->super_SubPoint).super_ConstSubPoint.value_.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ;
  local_98.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value =
       *(long *)&(y->super_SubPoint).super_ConstSubPoint.value_.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 .field_0x8;
  local_68 = size;
  if (-1 < local_98.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value ||
      local_98.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data == (PointerType)0x0) {
    ConstSubPoint::value(&local_58,(ConstSubPoint *)(in_RDX + 0x18));
    Manifold::pseudoLog(this_00,(RefVec *)&local_70,&local_98,&local_58);
    free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_98.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

Eigen::VectorXd Point::pseudoLog(const Point& y) const
{
  Eigen::VectorXd out(manifold_.tangentDim());
  manifold_.pseudoLog(out, this->value_, y.value());
  return out;
}